

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32
drwav_init_write__internal(drwav *pWav,drwav_data_format *pFormat,drwav_uint64 totalSampleCount)

{
  drwav_container dVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  drwav_uint32 value;
  char *pData;
  long lVar9;
  drwav_uint32 chunkSizeDATA;
  size_t local_48;
  
  uVar2 = 0;
  if (pWav->isSequentialWrite != 0) {
    uVar2 = (pWav->fmt).bitsPerSample * totalSampleCount;
    if (pFormat->container == drwav_container_riff && 0x3ffffff6 < uVar2 >> 5) {
      return 0;
    }
    uVar2 = uVar2 >> 3;
  }
  pWav->dataChunkDataSizeTargetWrite = uVar2;
  dVar1 = pFormat->container;
  value = (drwav_uint32)uVar2;
  if (dVar1 == drwav_container_rf64) {
    sVar8 = drwav__write(pWav,"RF64",4);
    sVar3 = drwav__write_u32ne_to_le(pWav,0xffffffff);
    sVar3 = sVar3 + sVar8;
    sVar8 = drwav__write(pWav,"WAVE",4);
LAB_0011de3e:
    lVar9 = sVar8 + sVar3;
  }
  else {
    if (dVar1 == drwav_container_w64) {
      local_48 = drwav__write(pWav,drwavGUID_W64_RIFF,0x10);
      sVar3 = drwav__write_u64ne_to_le(pWav,uVar2 + 0x68);
      sVar8 = 0x10;
      pData = (char *)drwavGUID_W64_WAVE;
LAB_0011ddec:
      sVar8 = drwav__write(pWav,pData,sVar8);
      sVar8 = sVar8 + local_48;
      goto LAB_0011de3e;
    }
    if (dVar1 == drwav_container_riff) {
      local_48 = drwav__write(pWav,"RIFF",4);
      sVar3 = drwav__write_u32ne_to_le(pWav,value + 0x1c);
      pData = "WAVE";
      sVar8 = 4;
      goto LAB_0011ddec;
    }
    lVar9 = 0;
  }
  if (pFormat->container == drwav_container_rf64) {
    sVar3 = drwav__write(pWav,"ds64",4);
    sVar8 = drwav__write_u32ne_to_le(pWav,0x1c);
    sVar4 = drwav__write_u64ne_to_le(pWav,uVar2 + 0x24);
    sVar5 = drwav__write_u64ne_to_le(pWav,uVar2);
    sVar6 = drwav__write_u64ne_to_le(pWav,totalSampleCount);
    sVar7 = drwav__write_u32ne_to_le(pWav,0);
    lVar9 = sVar7 + sVar6 + sVar5 + sVar4 + sVar8 + sVar3 + lVar9;
  }
  dVar1 = pFormat->container;
  if (dVar1 == drwav_container_rf64) {
LAB_0011dee9:
    sVar3 = drwav__write(pWav,"fmt ",4);
    sVar8 = drwav__write_u32ne_to_le(pWav,0x10);
LAB_0011df33:
    lVar9 = lVar9 + sVar8 + sVar3;
  }
  else {
    if (dVar1 == drwav_container_w64) {
      sVar3 = drwav__write(pWav,drwavGUID_W64_FMT,0x10);
      sVar8 = drwav__write_u64ne_to_le(pWav,0x28);
      goto LAB_0011df33;
    }
    if (dVar1 == drwav_container_riff) goto LAB_0011dee9;
  }
  sVar3 = drwav__write_u16ne_to_le(pWav,(pWav->fmt).formatTag);
  sVar8 = drwav__write_u16ne_to_le(pWav,(pWav->fmt).channels);
  sVar4 = drwav__write_u32ne_to_le(pWav,(pWav->fmt).sampleRate);
  sVar5 = drwav__write_u32ne_to_le(pWav,(pWav->fmt).avgBytesPerSec);
  sVar6 = drwav__write_u16ne_to_le(pWav,(pWav->fmt).blockAlign);
  sVar7 = drwav__write_u16ne_to_le(pWav,(pWav->fmt).bitsPerSample);
  pWav->dataChunkDataPos = sVar7 + sVar6 + sVar5 + sVar4 + sVar8 + sVar3 + lVar9;
  dVar1 = pFormat->container;
  if (dVar1 == drwav_container_rf64) {
    drwav__write(pWav,"data",4);
    value = 0xffffffff;
  }
  else {
    if (dVar1 == drwav_container_w64) {
      drwav__write(pWav,drwavGUID_W64_DATA,0x10);
      drwav__write_u64ne_to_le(pWav,uVar2 + 0x18);
      goto LAB_0011e024;
    }
    if (dVar1 != drwav_container_riff) goto LAB_0011e024;
    drwav__write(pWav,"data",4);
  }
  drwav__write_u32ne_to_le(pWav,value);
LAB_0011e024:
  pWav->container = pFormat->container;
  pWav->channels = (drwav_uint16)pFormat->channels;
  pWav->sampleRate = pFormat->sampleRate;
  pWav->bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
  pWav->translatedFormatTag = (drwav_uint16)pFormat->format;
  return 1;
}

Assistant:

static drwav_bool32 drwav_init_write__internal(drwav* pWav, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount)
{
    /* The function assumes drwav_preinit_write() was called beforehand. */

    size_t runningPos = 0;
    drwav_uint64 initialDataChunkSize = 0;
    drwav_uint64 chunkSizeFMT;

    /*
    The initial values for the "RIFF" and "data" chunks depends on whether or not we are initializing in sequential mode or not. In
    sequential mode we set this to its final values straight away since they can be calculated from the total sample count. In non-
    sequential mode we initialize it all to zero and fill it out in drwav_uninit() using a backwards seek.
    */
    if (pWav->isSequentialWrite) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;

        /*
        The RIFF container has a limit on the number of samples. drwav is not allowing this. There's no practical limits for Wave64
        so for the sake of simplicity I'm not doing any validation for that.
        */
        if (pFormat->container == drwav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFFUL - 36)) {
                return DRWAV_FALSE; /* Not enough room to store every sample. */
            }
        }
    }

    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;


    /* "RIFF" chunk. */
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeRIFF = 28 + (drwav_uint32)initialDataChunkSize;   /* +28 = "WAVE" + [sizeof "fmt " chunk] */
        runningPos += drwav__write(pWav, "RIFF", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, chunkSizeRIFF);
        runningPos += drwav__write(pWav, "WAVE", 4);
    } else if (pFormat->container == drwav_container_w64) {
        drwav_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;            /* +24 because W64 includes the size of the GUID and size fields. */
        runningPos += drwav__write(pWav, drwavGUID_W64_RIFF, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeRIFF);
        runningPos += drwav__write(pWav, drwavGUID_W64_WAVE, 16);
    } else if (pFormat->container == drwav_container_rf64) {
        runningPos += drwav__write(pWav, "RF64", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, 0xFFFFFFFF);               /* Always 0xFFFFFFFF for RF64. Set to a proper value in the "ds64" chunk. */
        runningPos += drwav__write(pWav, "WAVE", 4);
    }

    
    /* "ds64" chunk (RF64 only). */
    if (pFormat->container == drwav_container_rf64) {
        drwav_uint32 initialds64ChunkSize = 28;                                 /* 28 = [Size of RIFF (8 bytes)] + [Size of DATA (8 bytes)] + [Sample Count (8 bytes)] + [Table Length (4 bytes)]. Table length always set to 0. */
        drwav_uint64 initialRiffChunkSize = 8 + initialds64ChunkSize + initialDataChunkSize;    /* +8 for the ds64 header. */

        runningPos += drwav__write(pWav, "ds64", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, initialds64ChunkSize);     /* Size of ds64. */
        runningPos += drwav__write_u64ne_to_le(pWav, initialRiffChunkSize);     /* Size of RIFF. Set to true value at the end. */
        runningPos += drwav__write_u64ne_to_le(pWav, initialDataChunkSize);     /* Size of DATA. Set to true value at the end. */
        runningPos += drwav__write_u64ne_to_le(pWav, totalSampleCount);         /* Sample count. */
        runningPos += drwav__write_u32ne_to_le(pWav, 0);                        /* Table length. Always set to zero in our case since we're not doing any other chunks than "DATA". */
    }


    /* "fmt " chunk. */
    if (pFormat->container == drwav_container_riff || pFormat->container == drwav_container_rf64) {
        chunkSizeFMT = 16;
        runningPos += drwav__write(pWav, "fmt ", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, (drwav_uint32)chunkSizeFMT);
    } else if (pFormat->container == drwav_container_w64) {
        chunkSizeFMT = 40;
        runningPos += drwav__write(pWav, drwavGUID_W64_FMT, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeFMT);
    }

    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.formatTag);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.channels);
    runningPos += drwav__write_u32ne_to_le(pWav, pWav->fmt.sampleRate);
    runningPos += drwav__write_u32ne_to_le(pWav, pWav->fmt.avgBytesPerSec);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.blockAlign);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.bitsPerSample);

    pWav->dataChunkDataPos = runningPos;

    /* "data" chunk. */
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeDATA = (drwav_uint32)initialDataChunkSize;
        runningPos += drwav__write(pWav, "data", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == drwav_container_w64) {
        drwav_uint64 chunkSizeDATA = 24 + initialDataChunkSize;     /* +24 because W64 includes the size of the GUID and size fields. */
        runningPos += drwav__write(pWav, drwavGUID_W64_DATA, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == drwav_container_rf64) {
        runningPos += drwav__write(pWav, "data", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, 0xFFFFFFFF);   /* Always set to 0xFFFFFFFF for RF64. The true size of the data chunk is specified in the ds64 chunk. */
    }

    /*
    The runningPos variable is incremented in the section above but is left unused which is causing some static analysis tools to detect it
    as a dead store. I'm leaving this as-is for safety just in case I want to expand this function later to include other tags and want to
    keep track of the running position for whatever reason. The line below should silence the static analysis tools.
    */
    (void)runningPos;

    /* Set some properties for the client's convenience. */
    pWav->container = pFormat->container;
    pWav->channels = (drwav_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (drwav_uint16)pFormat->format;

    return DRWAV_TRUE;
}